

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void Excel::Parser::handleFORMULA(Record *record,Stream *stream,size_t sheetIdx,IStorage *storage)

{
  IStorage *__nbytes;
  void *__buf;
  BiffVersion in_R9D;
  vector<int,_std::allocator<int>_> borders;
  Formula formula;
  Record stringRecord;
  Stream local_268;
  long local_258;
  wstring local_248;
  undefined1 local_228 [24];
  _Alloc_hider local_210;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_200;
  undefined1 local_1e8 [8];
  undefined **local_1e0;
  ByteOrder local_1d8;
  stringstream local_1d0 [128];
  ios_base local_150 [264];
  pointer local_48;
  pointer piStack_40;
  pointer local_38;
  
  __nbytes = storage;
  Formula::Formula((Formula *)local_228,record);
  if (local_228._0_4_ == StringValue) {
    local_1e8._0_2_ = 0;
    local_1e8._4_4_ = 0;
    local_1d8 = stream->m_byteOrder;
    local_1e0 = &PTR__RecordSubstream_00137b30;
    std::__cxx11::stringstream::stringstream(local_1d0);
    local_48 = (pointer)0x0;
    piStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    Record::read((Record *)local_1e8,(int)stream,__buf,(size_t)__nbytes);
    local_268._vptr_Stream = (_func_int **)0x0;
    local_268.m_byteOrder = BigEndian;
    local_268._12_4_ = 0;
    local_258 = 0;
    loadString_abi_cxx11_
              (&local_248,(Excel *)&local_1e0,&local_268,(vector<int,_std::allocator<int>_> *)0x2,
               0x600,in_R9D);
    std::__cxx11::wstring::_M_assign((wstring *)&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity * 4 + 4);
    }
    if (local_268._vptr_Stream != (_func_int **)0x0) {
      operator_delete(local_268._vptr_Stream,local_258 - (long)local_268._vptr_Stream);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    local_1e0 = &PTR__RecordSubstream_00137b30;
    std::__cxx11::stringstream::~stringstream(local_1d0);
    std::ios_base::~ios_base(local_150);
  }
  (*storage->_vptr_IStorage[8])(storage,sheetIdx,local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_210._M_p != &local_200) {
    operator_delete(local_210._M_p,local_200._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

inline void
Parser::handleFORMULA( Record & record, Stream & stream, size_t sheetIdx, IStorage & storage )
{
	Formula formula( record );

	if( formula.valueType() == Formula::StringValue )
	{
		Record stringRecord( stream );

		std::vector< int32_t > borders;

		formula.setString( loadString( stringRecord.dataStream(), borders ) );
	}

	storage.onCell( sheetIdx, formula );
}